

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ngx_http_index_module.c
# Opt level: O0

ngx_int_t ngx_http_index_error
                    (ngx_http_request_t *r,ngx_http_core_loc_conf_t *clcf,u_char *file,ngx_err_t err
                    )

{
  ngx_err_t err_local;
  u_char *file_local;
  ngx_http_core_loc_conf_t *clcf_local;
  ngx_http_request_t *r_local;
  
  if (err == 0xd) {
    if (3 < r->connection->log->log_level) {
      ngx_log_error_core(4,r->connection->log,0xd,"\"%s\" is forbidden",file);
    }
    r_local = (ngx_http_request_t *)0x193;
  }
  else {
    if ((clcf->log_not_found != 0) && (3 < r->connection->log->log_level)) {
      ngx_log_error_core(4,r->connection->log,err,"\"%s\" is not found",file);
    }
    r_local = (ngx_http_request_t *)0x194;
  }
  return (ngx_int_t)r_local;
}

Assistant:

static ngx_int_t
ngx_http_index_error(ngx_http_request_t *r, ngx_http_core_loc_conf_t  *clcf,
    u_char *file, ngx_err_t err)
{
    if (err == NGX_EACCES) {
        ngx_log_error(NGX_LOG_ERR, r->connection->log, err,
                      "\"%s\" is forbidden", file);

        return NGX_HTTP_FORBIDDEN;
    }

    if (clcf->log_not_found) {
        ngx_log_error(NGX_LOG_ERR, r->connection->log, err,
                      "\"%s\" is not found", file);
    }

    return NGX_HTTP_NOT_FOUND;
}